

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O2

void duckdb_je_buf_writer_pipe(buf_writer_t *buf_writer,read_cb_t *read_cb,void *read_cbopaque)

{
  void **ppvVar1;
  write_cb_t **ppwVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  if (buf_writer->buf == (char *)0x0) {
    ppwVar2 = &buf_writer->write_cb;
    ppvVar1 = &buf_writer->cbopaque;
    buf_writer = &duckdb_je_buf_writer_pipe::backup_buf_writer;
    duckdb_je_buf_writer_init
              ((tsdn_t *)0x0,&duckdb_je_buf_writer_pipe::backup_buf_writer,*ppwVar2,*ppvVar1,
               duckdb_je_buf_writer_pipe::backup_buf,0x10);
  }
  lVar4 = 0;
  do {
    sVar3 = lVar4 + buf_writer->buf_end;
    buf_writer->buf_end = sVar3;
    sVar5 = buf_writer->buf_size;
    if (sVar3 == sVar5) {
      duckdb_je_buf_writer_flush(buf_writer);
      sVar5 = buf_writer->buf_size;
      sVar3 = buf_writer->buf_end;
    }
    lVar4 = (*read_cb)(read_cbopaque,buf_writer->buf + sVar3,sVar5 - sVar3);
  } while (0 < lVar4);
  duckdb_je_buf_writer_flush(buf_writer);
  return;
}

Assistant:

void
buf_writer_pipe(buf_writer_t *buf_writer, read_cb_t *read_cb,
    void *read_cbopaque) {
	/*
	 * A tiny local buffer in case the buffered writer failed to allocate
	 * at init.
	 */
	static char backup_buf[16];
	static buf_writer_t backup_buf_writer;

	buf_writer_assert(buf_writer);
	assert(read_cb != NULL);
	if (buf_writer->buf == NULL) {
		buf_writer_init(TSDN_NULL, &backup_buf_writer,
		    buf_writer->write_cb, buf_writer->cbopaque, backup_buf,
		    sizeof(backup_buf));
		buf_writer = &backup_buf_writer;
	}
	assert(buf_writer->buf != NULL);
	ssize_t nread = 0;
	do {
		buf_writer->buf_end += nread;
		buf_writer_assert(buf_writer);
		if (buf_writer->buf_end == buf_writer->buf_size) {
			buf_writer_flush(buf_writer);
		}
		nread = read_cb(read_cbopaque,
		    buf_writer->buf + buf_writer->buf_end,
		    buf_writer->buf_size - buf_writer->buf_end);
	} while (nread > 0);
	buf_writer_flush(buf_writer);
}